

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

int __thiscall
QMakeProperty::queryProperty
          (QMakeProperty *this,QStringList *optionProperties,PropertyPrinter *printer)

{
  bool bVar1;
  QMakeProperty *pQVar2;
  pair<QString,_QString> *this_00;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QString *prop_1;
  QStringList *__range2_2;
  QString *prop;
  add_const_t<QList<QString>_> *__range2_1;
  uint i;
  QString *key;
  QStringList *__range2;
  int ret;
  ProKey pkey;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  ProString dval;
  ProString sval;
  ProString gval;
  ProString pval;
  ProString val_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QStringList specialProps;
  QString val;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList keys;
  QList<std::pair<QString,_QString>_> output;
  ProString *in_stack_fffffffffffff948;
  undefined4 in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff954;
  pair<QString,_QString> *in_stack_fffffffffffff958;
  pair<QString,_QString> *in_stack_fffffffffffff960;
  ProString *in_stack_fffffffffffff968;
  QMakeProperty *in_stack_fffffffffffff970;
  char *in_stack_fffffffffffff988;
  uint local_654;
  int local_63c;
  undefined1 local_560 [48];
  QString *local_530;
  const_iterator local_528;
  const_iterator local_520 [4];
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_500;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_4a8;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_450;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_3f8;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_370;
  ProString local_330;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_300;
  ProString local_2c0;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_290;
  ProString local_250;
  QStringBuilder<const_QString_&,_const_char_(&)[5]> local_220;
  ProString local_1e0 [2];
  ProString local_180;
  QString *local_150;
  const_iterator local_148;
  const_iterator local_140 [7];
  storage_type *local_108;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  QString *local_70;
  const_iterator local_68;
  const_iterator local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  QList<std::pair<QString,_QString>_> local_40;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_40.d.ptr = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
  local_40.d.size = -0x5555555555555556;
  QList<std::pair<QString,_QString>_>::QList((QList<std::pair<QString,_QString>_> *)0x334b6b);
  local_63c = 0;
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x334b80);
  if (bVar1) {
    initSettings((QMakeProperty *)in_stack_fffffffffffff958);
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QSettings::childKeys();
    local_60.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_60 = QList<QString>::begin
                         ((QList<QString> *)
                          CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    local_68.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_68 = QList<QString>::end((QList<QString> *)
                                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    while( true ) {
      local_70 = local_68.i;
      bVar1 = QList<QString>::const_iterator::operator!=(&local_60,local_68);
      if (!bVar1) break;
      QList<QString>::const_iterator::operator*(&local_60);
      local_88 = 0xaaaaaaaaaaaaaaaa;
      local_80 = 0xaaaaaaaaaaaaaaaa;
      local_78 = 0xaaaaaaaaaaaaaaaa;
      QAnyStringView::QAnyStringView
                ((QAnyStringView *)in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first);
      QSettings::value((QAnyStringView *)&local_28);
      QVariant::toString();
      QVariant::~QVariant(&local_28);
      std::pair<QString,_QString>::pair<QString_&,_true>
                (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
                 (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      QList<std::pair<QString,_QString>_>::append
                ((QList<std::pair<QString,_QString>_> *)
                 CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (rvalue_ref)in_stack_fffffffffffff948);
      std::pair<QString,_QString>::~pair
                ((pair<QString,_QString> *)
                 CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      QString::~QString((QString *)0x334d5e);
      QList<QString>::const_iterator::operator++(&local_60);
    }
    local_e0 = 0xaaaaaaaaaaaaaaaa;
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    local_d0 = 0xaaaaaaaaaaaaaaaa;
    QList<QString>::QList((QList<QString> *)0x334daa);
    for (local_654 = 0; local_654 < 0x17; local_654 = local_654 + 1) {
      QByteArrayView::QByteArrayView<const_char_*,_true>
                ((QByteArrayView *)in_stack_fffffffffffff960,(char **)in_stack_fffffffffffff958);
      QVar3.m_data = local_108;
      QVar3.m_size = (qsizetype)local_f8;
      QString::fromLatin1(QVar3);
      QList<QString>::append
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 &in_stack_fffffffffffff948->m_string);
      QString::~QString((QString *)0x334e1a);
    }
    QString::QString(&in_stack_fffffffffffff958->first,in_stack_fffffffffffff988);
    QList<QString>::append
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
               &in_stack_fffffffffffff948->m_string);
    QString::~QString((QString *)0x334e5d);
    QString::QString(&in_stack_fffffffffffff958->first,in_stack_fffffffffffff988);
    QList<QString>::append
              ((QList<QString> *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
               &in_stack_fffffffffffff948->m_string);
    QString::~QString((QString *)0x334e93);
    local_140[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_140[0] = QList<QString>::begin
                             ((QList<QString> *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    local_148.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_148 = QList<QString>::end((QList<QString> *)
                                    CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    while( true ) {
      local_150 = local_148.i;
      bVar1 = QList<QString>::const_iterator::operator!=(local_140,local_148);
      if (!bVar1) break;
      pQVar2 = (QMakeProperty *)QList<QString>::const_iterator::operator*(local_140);
      memset(&local_180,0xaa,0x30);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff958,
                     (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      value(in_stack_fffffffffffff970,(ProKey *)in_stack_fffffffffffff968);
      ProKey::~ProKey((ProKey *)0x334f90);
      memset(local_1e0,0xaa,0x30);
      local_220 = ::operator+((QString *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                              (char (*) [5])in_stack_fffffffffffff948);
      ProKey::ProKey<QString_const&,char_const(&)[5]>
                ((ProKey *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff948);
      value(in_stack_fffffffffffff970,(ProKey *)in_stack_fffffffffffff968);
      ProKey::~ProKey((ProKey *)0x335004);
      memset(&local_250,0xaa,0x30);
      local_290 = ::operator+((QString *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                              (char (*) [5])in_stack_fffffffffffff948);
      ProKey::ProKey<QString_const&,char_const(&)[5]>
                ((ProKey *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff948);
      value(in_stack_fffffffffffff970,(ProKey *)in_stack_fffffffffffff968);
      ProKey::~ProKey((ProKey *)0x335078);
      memset(&local_2c0,0xaa,0x30);
      local_300 = ::operator+((QString *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                              (char (*) [5])in_stack_fffffffffffff948);
      ProKey::ProKey<QString_const&,char_const(&)[5]>
                ((ProKey *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff948);
      value(in_stack_fffffffffffff970,(ProKey *)in_stack_fffffffffffff968);
      ProKey::~ProKey((ProKey *)0x3350ec);
      memset(&local_330,0xaa,0x30);
      local_370 = ::operator+((QString *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                              (char (*) [5])in_stack_fffffffffffff948);
      ProKey::ProKey<QString_const&,char_const(&)[5]>
                ((ProKey *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff948);
      value(in_stack_fffffffffffff970,(ProKey *)in_stack_fffffffffffff968);
      ProKey::~ProKey((ProKey *)0x335160);
      ProString::toQString(in_stack_fffffffffffff948);
      std::pair<QString,_QString>::pair<QString,_true>
                (in_stack_fffffffffffff960,&in_stack_fffffffffffff958->first,
                 (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      QList<std::pair<QString,_QString>_>::append
                ((QList<std::pair<QString,_QString>_> *)
                 CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                 (rvalue_ref)in_stack_fffffffffffff948);
      std::pair<QString,_QString>::~pair
                ((pair<QString,_QString> *)
                 CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      QString::~QString((QString *)0x3351c8);
      bVar1 = ProString::isEmpty(local_1e0);
      in_stack_fffffffffffff970 = pQVar2;
      if ((!bVar1) &&
         (bVar1 = ProString::operator!=
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             in_stack_fffffffffffff948), in_stack_fffffffffffff970 = pQVar2, bVar1))
      {
        local_3f8 = ::operator+((QString *)
                                CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                (char (*) [5])in_stack_fffffffffffff948);
        ProString::toQString(in_stack_fffffffffffff948);
        std::pair<QString,_QString>::
        pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                  (in_stack_fffffffffffff960,
                   (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff958,
                   (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QList<std::pair<QString,_QString>_>::append
                  ((QList<std::pair<QString,_QString>_> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   (rvalue_ref)in_stack_fffffffffffff948);
        std::pair<QString,_QString>::~pair
                  ((pair<QString,_QString> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QString::~QString((QString *)0x33527d);
        in_stack_fffffffffffff970 = pQVar2;
      }
      bVar1 = ProString::isEmpty(&local_250);
      if (!bVar1) {
        bVar1 = ProString::isEmpty(local_1e0);
        if (bVar1) {
          in_stack_fffffffffffff968 = &local_180;
        }
        else {
          in_stack_fffffffffffff968 = local_1e0;
        }
        bVar1 = ProString::operator!=
                          ((ProString *)
                           CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                           in_stack_fffffffffffff948);
        if (bVar1) {
          local_450 = ::operator+((QString *)
                                  CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                  (char (*) [5])in_stack_fffffffffffff948);
          ProString::toQString(in_stack_fffffffffffff948);
          std::pair<QString,_QString>::
          pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                    (in_stack_fffffffffffff960,
                     (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff958
                     ,(QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
          QList<std::pair<QString,_QString>_>::append
                    ((QList<std::pair<QString,_QString>_> *)
                     CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                     (rvalue_ref)in_stack_fffffffffffff948);
          std::pair<QString,_QString>::~pair
                    ((pair<QString,_QString> *)
                     CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
          QString::~QString((QString *)0x335360);
        }
      }
      bVar1 = ProString::isEmpty(&local_2c0);
      if ((!bVar1) &&
         (bVar1 = ProString::operator!=
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             in_stack_fffffffffffff948), bVar1)) {
        local_4a8 = ::operator+((QString *)
                                CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                (char (*) [5])in_stack_fffffffffffff948);
        ProString::toQString(in_stack_fffffffffffff948);
        std::pair<QString,_QString>::
        pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                  (in_stack_fffffffffffff960,
                   (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff958,
                   (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QList<std::pair<QString,_QString>_>::append
                  ((QList<std::pair<QString,_QString>_> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   (rvalue_ref)in_stack_fffffffffffff948);
        std::pair<QString,_QString>::~pair
                  ((pair<QString,_QString> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QString::~QString((QString *)0x335415);
      }
      bVar1 = ProString::isEmpty(&local_330);
      if ((!bVar1) &&
         (bVar1 = ProString::operator!=
                            ((ProString *)
                             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                             in_stack_fffffffffffff948), bVar1)) {
        local_500 = ::operator+((QString *)
                                CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                                (char (*) [5])in_stack_fffffffffffff948);
        ProString::toQString(in_stack_fffffffffffff948);
        std::pair<QString,_QString>::
        pair<QStringBuilder<const_QString_&,_const_char_(&)[5]>,_QString,_true>
                  (in_stack_fffffffffffff960,
                   (QStringBuilder<const_QString_&,_const_char_(&)[5]> *)in_stack_fffffffffffff958,
                   (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QList<std::pair<QString,_QString>_>::append
                  ((QList<std::pair<QString,_QString>_> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   (rvalue_ref)in_stack_fffffffffffff948);
        std::pair<QString,_QString>::~pair
                  ((pair<QString,_QString> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QString::~QString((QString *)0x3354ca);
      }
      ProString::~ProString((ProString *)0x3354d7);
      ProString::~ProString((ProString *)0x3354e4);
      ProString::~ProString((ProString *)0x3354f1);
      ProString::~ProString((ProString *)0x3354fe);
      ProString::~ProString((ProString *)0x33550b);
      QList<QString>::const_iterator::operator++(local_140);
    }
    QList<QString>::~QList((QList<QString> *)0x33552a);
    QList<QString>::~QList((QList<QString> *)0x335537);
  }
  else {
    local_520[0].i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_520[0] = QList<QString>::begin
                             ((QList<QString> *)
                              CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    local_528.i = (QString *)0xaaaaaaaaaaaaaaaa;
    local_528 = QList<QString>::end((QList<QString> *)
                                    CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
    while( true ) {
      local_530 = local_528.i;
      bVar1 = QList<QString>::const_iterator::operator!=(local_520,local_528);
      if (!bVar1) break;
      this_00 = (pair<QString,_QString> *)QList<QString>::const_iterator::operator*(local_520);
      memset(local_560,0xaa,0x30);
      ProKey::ProKey((ProKey *)in_stack_fffffffffffff958,
                     (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      bVar1 = hasValue((QMakeProperty *)in_stack_fffffffffffff958,
                       (ProKey *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
      if (bVar1) {
        value(in_stack_fffffffffffff970,(ProKey *)in_stack_fffffffffffff968);
        ProString::toQString(in_stack_fffffffffffff948);
        std::pair<QString,_QString>::pair<QString,_true>
                  (in_stack_fffffffffffff960,&this_00->first,
                   (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QList<std::pair<QString,_QString>_>::append
                  ((QList<std::pair<QString,_QString>_> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   (rvalue_ref)in_stack_fffffffffffff948);
        std::pair<QString,_QString>::~pair
                  ((pair<QString,_QString> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QString::~QString((QString *)0x33571e);
        ProString::~ProString((ProString *)0x33572b);
        in_stack_fffffffffffff958 = this_00;
      }
      else {
        local_63c = 0x65;
        QString::QString(&in_stack_fffffffffffff958->first,(char *)this_00);
        std::pair<QString,_QString>::pair<QString,_true>
                  (this_00,&in_stack_fffffffffffff958->first,
                   (QString *)CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QList<std::pair<QString,_QString>_>::append
                  ((QList<std::pair<QString,_QString>_> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),
                   (rvalue_ref)in_stack_fffffffffffff948);
        std::pair<QString,_QString>::~pair
                  ((pair<QString,_QString> *)
                   CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950));
        QString::~QString((QString *)0x335697);
        in_stack_fffffffffffff960 = this_00;
      }
      ProKey::~ProKey((ProKey *)0x335738);
      QList<QString>::const_iterator::operator++(local_520);
    }
  }
  std::function<void_(const_QList<std::pair<QString,_QString>_>_&)>::operator()
            ((function<void_(const_QList<std::pair<QString,_QString>_>_&)> *)
             CONCAT44(in_stack_fffffffffffff954,in_stack_fffffffffffff950),&local_40);
  QList<std::pair<QString,_QString>_>::~QList((QList<std::pair<QString,_QString>_> *)0x335776);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_63c;
}

Assistant:

int QMakeProperty::queryProperty(const QStringList &optionProperties,
                                 const PropertyPrinter &printer)
{
    QList<QPair<QString, QString>> output;
    int ret = PropSuccessRetCode;
    if (optionProperties.isEmpty()) {
        initSettings();
        const auto keys = settings->childKeys();
        for (const QString &key : keys) {
            QString val = settings->value(key).toString();
            output.append({ key, val });
        }
        QStringList specialProps;
        for (unsigned i = 0; i < sizeof(propList) / sizeof(propList[0]); i++)
            specialProps.append(QString::fromLatin1(propList[i].name));
#ifdef QMAKE_VERSION_STR
        specialProps.append("QMAKE_VERSION");
#endif
#ifdef QT_VERSION_STR
        specialProps.append("QT_VERSION");
#endif
        for (const QString &prop : std::as_const(specialProps)) {
            ProString val = value(ProKey(prop));
            ProString pval = value(ProKey(prop + "/raw"));
            ProString gval = value(ProKey(prop + "/get"));
            ProString sval = value(ProKey(prop + "/src"));
            ProString dval = value(ProKey(prop + "/dev"));
            output.append({ prop, val.toQString() });
            if (!pval.isEmpty() && pval != val)
                output.append({ prop + "/raw", pval.toQString() });
            if (!gval.isEmpty() && gval != (pval.isEmpty() ? val : pval))
                output.append({ prop + "/get", gval.toQString() });
            if (!sval.isEmpty() && sval != gval)
                output.append({ prop + "/src", sval.toQString() });
            if (!dval.isEmpty() && dval != pval)
                output.append({ prop + "/dev", dval.toQString() });
        }
    } else {
        for (const auto &prop : optionProperties) {
            const ProKey pkey(prop);
            if (!hasValue(pkey)) {
                ret = PropFailRetCode;
                output.append({ prop, QString("**Unknown**") });
            } else {
                output.append({ prop, value(pkey).toQString() });
            }
        }
    }
    printer(output);
    return ret;
}